

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

void __thiscall
QVarLengthArray<QRhiBufferData,_4LL>::append
          (QVarLengthArray<QRhiBufferData,_4LL> *this,QRhiBufferData *t)

{
  long in_FS_OFFSET;
  QRhiBufferData local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QVLABase<QRhiBufferData>).super_QVLABaseBase.s ==
      (this->super_QVLABase<QRhiBufferData>).super_QVLABaseBase.a) {
    local_18 = (QRhiBufferData)t->d;
    if (local_18.d != (QRhiBufferDataPrivate *)0x0) {
      (local_18.d)->ref = (local_18.d)->ref + 1;
    }
    emplace_back<QRhiBufferData>(this,&local_18);
    QRhiBufferData::~QRhiBufferData(&local_18);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    QVarLengthArray<QRhiBufferData,4ll>::emplace_back<QRhiBufferData_const&>
              ((QVarLengthArray<QRhiBufferData,4ll> *)this,t);
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void append(const T &t)
    {
        if (size() == capacity())
            emplace_back(T(t));
        else
            emplace_back(t);
    }